

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall QGraphicsView::mouseMoveEvent(QGraphicsView *this,QMouseEvent *event)

{
  QGraphicsViewPrivate *this_00;
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  LayoutDirection LVar5;
  int iVar6;
  QScrollBar *this_01;
  QScrollBar *this_02;
  int iVar7;
  double dVar8;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  double dVar9;
  undefined1 auVar10 [16];
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  if ((this_00->dragMode == ScrollHandDrag) && ((this_00->field_0x301 & 2) != 0)) {
    this_01 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    this_02 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    dVar8 = (double)QEventPoint::position();
    dVar9 = in_XMM1_Qa;
    uVar2 = QEventPoint::position();
    auVar13._0_8_ = (double)((ulong)dVar8 & 0x8000000000000000 | 0x3fe0000000000000) + dVar8;
    auVar13._8_8_ =
         (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM0_Qa;
    auVar12 = minpd(_DAT_0066f5d0,auVar13);
    auVar13 = maxpd(auVar12,_DAT_0066f5e0);
    auVar12._0_8_ = (double)((ulong)dVar9 & 0x8000000000000000 | 0x3fe0000000000000) + dVar9;
    auVar12._8_8_ =
         (double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) + in_XMM1_Qa;
    auVar12 = minpd(_DAT_0066f5d0,auVar12);
    auVar10._8_8_ = -(ulong)(DAT_0066f5e0._8_8_ < auVar12._8_8_);
    auVar10._0_8_ = -(ulong)((double)DAT_0066f5e0 < auVar12._0_8_);
    uVar3 = movmskpd(uVar2,auVar10);
    iVar7 = (int)auVar12._8_8_;
    if ((uVar3 & 2) == 0) {
      iVar7 = -0x80000000;
    }
    iVar1 = (int)auVar12._0_8_;
    if ((uVar3 & 1) == 0) {
      iVar1 = -0x80000000;
    }
    iVar11 = (int)auVar13._0_8_ - (int)auVar13._8_8_;
    iVar4 = QAbstractSlider::value(&this_01->super_QAbstractSlider);
    LVar5 = QWidget::layoutDirection((QWidget *)this);
    iVar6 = -iVar11;
    if (LVar5 == RightToLeft) {
      iVar6 = iVar11;
    }
    QAbstractSlider::setValue(&this_01->super_QAbstractSlider,iVar6 + iVar4);
    iVar6 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
    QAbstractSlider::setValue(&this_02->super_QAbstractSlider,iVar1 + (iVar6 - iVar7));
    this_00->handScrollMotions = this_00->handScrollMotions + 1;
  }
  QGraphicsViewPrivate::mouseMoveEventHandler(this_00,event);
  return;
}

Assistant:

void QGraphicsView::mouseMoveEvent(QMouseEvent *event)
{
    Q_D(QGraphicsView);

    if (d->dragMode == QGraphicsView::ScrollHandDrag) {
        if (d->handScrolling) {
            QScrollBar *hBar = horizontalScrollBar();
            QScrollBar *vBar = verticalScrollBar();
            QPoint delta = event->position().toPoint() - d->lastMouseEvent->position().toPoint();
            hBar->setValue(hBar->value() + (isRightToLeft() ? delta.x() : -delta.x()));
            vBar->setValue(vBar->value() - delta.y());

            // Detect how much we've scrolled to disambiguate scrolling from
            // clicking.
            ++d->handScrollMotions;
        }
    }

    d->mouseMoveEventHandler(event);
}